

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void encode_loopfilter(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  int iVar4;
  RefCntBuffer *pRVar5;
  aom_write_bit_buffer *in_RSI;
  AV1_COMMON *in_RDI;
  int changed_1;
  int delta_1;
  int i_1;
  int changed;
  int delta;
  int i;
  int8_t last_mode_deltas [2];
  int8_t last_ref_deltas [8];
  RefCntBuffer *buf;
  int meaningful;
  loopfilter *lf;
  int num_planes;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_40;
  undefined2 local_3a;
  AV1_COMMON *in_stack_ffffffffffffffc8;
  
  if (((in_RDI->features).allow_intrabc & 1U) == 0) {
    iVar2 = av1_num_planes(in_RDI);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    if ((1 < iVar2) && (((in_RDI->lf).filter_level[0] != 0 || ((in_RDI->lf).filter_level[1] != 0))))
    {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    aom_wb_write_bit(in_RSI,(uint)(in_RDI->lf).mode_ref_delta_enabled);
    _Var1 = is_mode_ref_delta_meaningful(in_stack_ffffffffffffffc8);
    aom_wb_write_bit(in_RSI,(uint)_Var1);
    if (_Var1 != 0) {
      pRVar5 = get_primary_ref_frame_buf
                         ((AV1_COMMON *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (pRVar5 == (RefCntBuffer *)0x0) {
        av1_set_default_ref_deltas(&stack0xffffffffffffffc8);
        av1_set_default_mode_deltas((int8_t *)&local_3a);
      }
      else {
        local_3a = *(undefined2 *)pRVar5->mode_deltas;
      }
      for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
        uVar3 = (uint)((in_RDI->lf).ref_deltas[local_40] != (&stack0xffffffffffffffc8)[local_40]);
        aom_wb_write_bit(in_RSI,uVar3);
        if (uVar3 != 0) {
          aom_wb_write_inv_signed_literal
                    ((aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        }
      }
      for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
        iVar4 = (int)(in_RDI->lf).mode_deltas[iVar2];
        uVar3 = (uint)(iVar4 != *(char *)((long)&local_3a + (long)iVar2));
        aom_wb_write_bit(in_RSI,uVar3);
        if (uVar3 != 0) {
          aom_wb_write_inv_signed_literal
                    ((aom_write_bit_buffer *)CONCAT44(iVar2,iVar4),uVar3,in_stack_ffffffffffffffa8);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void encode_loopfilter(AV1_COMMON *cm,
                                     struct aom_write_bit_buffer *wb) {
  assert(!cm->features.coded_lossless);
  if (cm->features.allow_intrabc) return;
  const int num_planes = av1_num_planes(cm);
  struct loopfilter *lf = &cm->lf;

  // Encode the loop filter level and type
  aom_wb_write_literal(wb, lf->filter_level[0], 6);
  aom_wb_write_literal(wb, lf->filter_level[1], 6);
  if (num_planes > 1) {
    if (lf->filter_level[0] || lf->filter_level[1]) {
      aom_wb_write_literal(wb, lf->filter_level_u, 6);
      aom_wb_write_literal(wb, lf->filter_level_v, 6);
    }
  }
  aom_wb_write_literal(wb, lf->sharpness_level, 3);

  aom_wb_write_bit(wb, lf->mode_ref_delta_enabled);

  // Write out loop filter deltas applied at the MB level based on mode or
  // ref frame (if they are enabled), only if there is information to write.
  int meaningful = is_mode_ref_delta_meaningful(cm);
  aom_wb_write_bit(wb, meaningful);
  if (!meaningful) {
    return;
  }

  const RefCntBuffer *buf = get_primary_ref_frame_buf(cm);
  int8_t last_ref_deltas[REF_FRAMES];
  int8_t last_mode_deltas[MAX_MODE_LF_DELTAS];
  if (buf == NULL) {
    av1_set_default_ref_deltas(last_ref_deltas);
    av1_set_default_mode_deltas(last_mode_deltas);
  } else {
    memcpy(last_ref_deltas, buf->ref_deltas, REF_FRAMES);
    memcpy(last_mode_deltas, buf->mode_deltas, MAX_MODE_LF_DELTAS);
  }
  for (int i = 0; i < REF_FRAMES; i++) {
    const int delta = lf->ref_deltas[i];
    const int changed = delta != last_ref_deltas[i];
    aom_wb_write_bit(wb, changed);
    if (changed) aom_wb_write_inv_signed_literal(wb, delta, 6);
  }
  for (int i = 0; i < MAX_MODE_LF_DELTAS; i++) {
    const int delta = lf->mode_deltas[i];
    const int changed = delta != last_mode_deltas[i];
    aom_wb_write_bit(wb, changed);
    if (changed) aom_wb_write_inv_signed_literal(wb, delta, 6);
  }
}